

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O0

from_chars_result_t<char>
fast_float::detail::parse_infnan<float,char>(char *first,char *last,float *value)

{
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  from_chars_result_t<char> fVar6;
  float local_6c;
  float local_4c;
  char *local_40;
  char *ptr;
  bool minusSign;
  float *value_local;
  char *last_local;
  char *first_local;
  from_chars_result_t<char> answer;
  
  memset(&first_local,0,0x10);
  answer.ptr._0_4_ = 0;
  bVar3 = *first == '-';
  last_local = first;
  if (bVar3) {
    last_local = first + 1;
  }
  first_local = first;
  if ((long)last - (long)last_local < 3) {
LAB_0055dae5:
    answer.ptr._0_4_ = 0x16;
    goto LAB_0055daec;
  }
  pcVar2 = str_const_nan<char>();
  bVar1 = fastfloat_strncasecmp<char>(last_local,pcVar2,3);
  if (bVar1) {
    pcVar2 = last_local + 3;
    first_local = pcVar2;
    fVar4 = std::numeric_limits<float>::quiet_NaN();
    fVar5 = std::numeric_limits<float>::quiet_NaN();
    local_4c = -fVar4;
    if (!bVar3) {
      local_4c = fVar5;
    }
    *value = local_4c;
    if ((pcVar2 != last) && (*pcVar2 == '(')) {
      for (local_40 = last_local + 4; local_40 != last; local_40 = local_40 + 1) {
        if (*local_40 == ')') {
          first_local = local_40 + 1;
          break;
        }
        if ((((*local_40 < 'a') || ('z' < *local_40)) && ((*local_40 < 'A' || ('Z' < *local_40))))
           && (((*local_40 < '0' || ('9' < *local_40)) && (*local_40 != '_')))) break;
      }
    }
    goto LAB_0055daec;
  }
  pcVar2 = str_const_inf<char>();
  bVar1 = fastfloat_strncasecmp<char>(last_local,pcVar2,3);
  if (!bVar1) goto LAB_0055dae5;
  if ((long)last - (long)last_local < 8) {
LAB_0055da83:
    first_local = last_local + 3;
  }
  else {
    pcVar2 = str_const_inf<char>();
    bVar1 = fastfloat_strncasecmp<char>(last_local + 3,pcVar2 + 3,5);
    if (!bVar1) goto LAB_0055da83;
    first_local = last_local + 8;
  }
  fVar4 = std::numeric_limits<float>::infinity();
  fVar5 = std::numeric_limits<float>::infinity();
  local_6c = -fVar4;
  if (!bVar3) {
    local_6c = fVar5;
  }
  *value = local_6c;
LAB_0055daec:
  fVar6.ec = answer.ptr._0_4_;
  fVar6.ptr = first_local;
  fVar6._12_4_ = 0;
  return fVar6;
}

Assistant:

from_chars_result_t<UC> FASTFLOAT_CONSTEXPR14
parse_infnan(UC const * first, UC const * last, T &value)  noexcept  {
  from_chars_result_t<UC> answer{};
  answer.ptr = first;
  answer.ec = std::errc(); // be optimistic
  bool minusSign = false;
  if (*first == UC('-')) { // assume first < last, so dereference without checks; C++17 20.19.3.(7.1) explicitly forbids '+' here
      minusSign = true;
      ++first;
  }
#ifdef FASTFLOAT_ALLOWS_LEADING_PLUS // disabled by default
  if (*first == UC('+')) {
      ++first;
  }
#endif
  if (last - first >= 3) {
    if (fastfloat_strncasecmp(first, str_const_nan<UC>(), 3)) {
      answer.ptr = (first += 3);
      value = minusSign ? -std::numeric_limits<T>::quiet_NaN() : std::numeric_limits<T>::quiet_NaN();
      // Check for possible nan(n-char-seq-opt), C++17 20.19.3.7, C11 7.20.1.3.3. At least MSVC produces nan(ind) and nan(snan).
      if(first != last && *first == UC('(')) {
        for(UC const * ptr = first + 1; ptr != last; ++ptr) {
          if (*ptr == UC(')')) {
            answer.ptr = ptr + 1; // valid nan(n-char-seq-opt)
            break;
          }
          else if(!((UC('a') <= *ptr && *ptr <= UC('z')) || (UC('A') <= *ptr && *ptr <= UC('Z')) || (UC('0') <= *ptr && *ptr <= UC('9')) || *ptr == UC('_')))
            break; // forbidden char, not nan(n-char-seq-opt)
        }
      }
      return answer;
    }
    if (fastfloat_strncasecmp(first, str_const_inf<UC>(), 3)) {
      if ((last - first >= 8) && fastfloat_strncasecmp(first + 3, str_const_inf<UC>() + 3, 5)) {
        answer.ptr = first + 8;
      } else {
        answer.ptr = first + 3;
      }
      value = minusSign ? -std::numeric_limits<T>::infinity() : std::numeric_limits<T>::infinity();
      return answer;
    }
  }
  answer.ec = std::errc::invalid_argument;
  return answer;
}